

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::startReplay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  int64_t iVar1;
  anon_class_48_6_f6e33a8e local_88;
  function<bool_(long)> local_58;
  int32_t local_34;
  string *psStack_30;
  int32_t replayStreamId_local;
  string *replayChannel_local;
  int64_t length_local;
  int64_t position_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_88.recordingId = &position_local;
  local_88.position = &length_local;
  local_88.length = (int64_t *)&replayChannel_local;
  local_88.replayStreamId = &local_34;
  local_88.this = this;
  local_88.replayChannel = replayChannel;
  local_34 = replayStreamId;
  psStack_30 = replayChannel;
  replayChannel_local = (string *)length;
  length_local = position;
  position_local = recordingId;
  recordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::startReplay(long,long,long,std::__cxx11::string_const&,int)::__0,void>
            ((function<bool(long)> *)&local_58,&local_88);
  iVar1 = callAndPollForResponse(this,&local_58,"start replay");
  std::function<bool_(long)>::~function(&local_58);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startReplay(std::int64_t recordingId, std::int64_t position, std::int64_t length,
                                       const std::string& replayChannel, std::int32_t replayStreamId) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->replay(recordingId, position, length, replayChannel, replayStreamId, correlationId,
                                         controlSessionId_);
        },
        "start replay");
}